

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pcryptohash-sha2-512.c
# Opt level: O2

PHashSHA2_512 * pp_crypto_hash_sha2_512_new_internal(pboolean is384)

{
  PHashSHA2_512 *ctx;
  
  ctx = (PHashSHA2_512 *)p_malloc0(0xd8);
  if (ctx != (PHashSHA2_512 *)0x0) {
    ctx->is384 = is384;
    p_crypto_hash_sha2_512_reset(ctx);
  }
  return ctx;
}

Assistant:

static PHashSHA2_512 *
pp_crypto_hash_sha2_512_new_internal (pboolean is384)
{
	PHashSHA2_512 *ret;

	if (P_UNLIKELY ((ret = p_malloc0 (sizeof (PHashSHA2_512))) == NULL))
		return NULL;

	ret->is384 = is384;

	p_crypto_hash_sha2_512_reset (ret);

	return ret;
}